

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatTest_::
OneofOnlySetLast<proto2_unittest::TestAllTypes>::TestBody
          (OneofOnlySetLast<proto2_unittest::TestAllTypes> *this)

{
  bool bVar1;
  size_t sVar2;
  char *in_R9;
  AssertHelper AStack_138;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_130;
  AssertionResult gtest_ar_;
  StringOutputStream raw_output;
  ArrayInputStream raw_input;
  string data;
  TestOneof oneof_dest;
  CodedInputStream input;
  undefined1 local_48 [56];
  
  proto2_unittest::TestOneofBackwardsCompatible::TestOneofBackwardsCompatible
            ((TestOneofBackwardsCompatible *)local_48);
  proto2_unittest::TestOneof::TestOneof(&oneof_dest);
  data._M_dataplus._M_p = (pointer)&data.field_2;
  data._M_string_length = 0;
  local_48._48_4_ = 100;
  local_48[0x10] = local_48[0x10] | 9;
  data.field_2._M_local_buf[0] = '\0';
  if ((local_48._8_8_ & 1) != 0) {
    local_48._8_8_ = *(undefined8 *)(local_48._8_8_ & 0xfffffffffffffffe);
  }
  ArenaStringPtr::Set((ArenaStringPtr *)(local_48 + 0x18),"101",(Arena *)local_48._8_8_);
  io::StringOutputStream::StringOutputStream(&raw_output,&data);
  io::CodedOutputStream::CodedOutputStream<google::protobuf::io::StringOutputStream,void>
            ((CodedOutputStream *)&input,&raw_output);
  sVar2 = proto2_unittest::TestOneofBackwardsCompatible::ByteSizeLong
                    ((TestOneofBackwardsCompatible *)local_48);
  WireFormat::SerializeWithCachedSizes((Message *)local_48,(int)sVar2,(CodedOutputStream *)&input);
  bVar1 = io::CodedOutputStream::HadError((CodedOutputStream *)&input);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_130);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&raw_input,(internal *)&gtest_ar_,(AssertionResult *)0xeeb03d,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_138,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
               ,0x128,(char *)raw_input.super_ZeroCopyInputStream._vptr_ZeroCopyInputStream);
    testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_130);
    testing::internal::AssertHelper::~AssertHelper(&AStack_138);
    std::__cxx11::string::~string((string *)&raw_input);
    if (local_130._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_130._M_head_impl + 8))();
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&input);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&input);
    io::ArrayInputStream::ArrayInputStream
              (&raw_input,data._M_dataplus._M_p,(int)data._M_string_length,-1);
    io::CodedInputStream::CodedInputStream(&input,&raw_input.super_ZeroCopyInputStream);
    WireFormat::ParseAndMergePartial(&input,&oneof_dest.super_Message);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = oneof_dest.field_0._impl_._oneof_case_[0] != 1;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&raw_output,(internal *)&gtest_ar_,
                 (AssertionResult *)"oneof_dest.has_foo_int()","true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x12f,(char *)raw_output.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream);
      testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&AStack_138);
      std::__cxx11::string::~string((string *)&raw_output);
      if (local_130._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_130._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = oneof_dest.field_0._impl_._oneof_case_[0] == 2;
    if (!gtest_ar_.success_) {
      testing::Message::Message((Message *)&local_130);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&raw_output,(internal *)&gtest_ar_,
                 (AssertionResult *)"oneof_dest.has_foo_string()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&AStack_138,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format_unittest.h"
                 ,0x130,(char *)raw_output.super_ZeroCopyOutputStream._vptr_ZeroCopyOutputStream);
      testing::internal::AssertHelper::operator=(&AStack_138,(Message *)&local_130);
      testing::internal::AssertHelper::~AssertHelper(&AStack_138);
      std::__cxx11::string::~string((string *)&raw_output);
      if (local_130._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_130._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    io::CodedInputStream::~CodedInputStream(&input);
  }
  std::__cxx11::string::~string((string *)&data);
  proto2_unittest::TestOneof::~TestOneof(&oneof_dest);
  proto2_unittest::TestOneofBackwardsCompatible::~TestOneofBackwardsCompatible
            ((TestOneofBackwardsCompatible *)local_48);
  return;
}

Assistant:

TYPED_TEST_P(WireFormatTest, OneofOnlySetLast) {
  typename TestFixture::TestOneofBackwardsCompatible source;
  typename TestFixture::TestOneof oneof_dest;
  std::string data;

  // Set two fields
  source.set_foo_int(100);
  source.set_foo_string("101");

  // Serialize and parse to oneof message. Generated serializer may not order
  // fields in tag order. Use WireFormat::SerializeWithCachedSizes instead as
  // it sorts fields beforehand.
  {
    io::StringOutputStream raw_output(&data);
    io::CodedOutputStream output(&raw_output);
    WireFormat::SerializeWithCachedSizes(source, source.ByteSizeLong(),
                                         &output);
    ASSERT_FALSE(output.HadError());
  }
  io::ArrayInputStream raw_input(data.data(), data.size());
  io::CodedInputStream input(&raw_input);
  WireFormat::ParseAndMergePartial(&input, &oneof_dest);

  // Only the last field is set.
  EXPECT_FALSE(oneof_dest.has_foo_int());
  EXPECT_TRUE(oneof_dest.has_foo_string());
}